

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall
ThreadContext::RegisterStoreFieldInlineCache
          (ThreadContext *this,InlineCache *inlineCache,PropertyId propertyId)

{
  bool bVar1;
  PropertyRecord *pPVar2;
  
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TraceInlineCacheInvalidationPhase);
  if (bVar1) {
    pPVar2 = GetPropertyName(this,propertyId);
    Output::Print(L"InlineCacheInvalidation: registering store field cache 0x%p for property %s(%u)\n"
                  ,inlineCache,pPVar2 + 1,(ulong)(uint)propertyId);
    Output::Flush();
  }
  RegisterInlineCache(this,&this->storeFieldInlineCacheByPropId,inlineCache,propertyId);
  return;
}

Assistant:

void
ThreadContext::RegisterStoreFieldInlineCache(Js::InlineCache * inlineCache, Js::PropertyId propertyId)
{
    if (PHASE_TRACE1(Js::TraceInlineCacheInvalidationPhase))
    {
        Output::Print(_u("InlineCacheInvalidation: registering store field cache 0x%p for property %s(%u)\n"),
            inlineCache, GetPropertyName(propertyId)->GetBuffer(), propertyId);
        Output::Flush();
    }

    RegisterInlineCache(storeFieldInlineCacheByPropId, inlineCache, propertyId);
}